

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::SubRoutineLocCompilationNonConstLoc::Run
          (SubRoutineLocCompilationNonConstLoc *this)

{
  long lVar1;
  string def;
  allocator<char> local_51;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "\nconst int i = 1;\nsubroutine vec4 st0(float param);\nsubroutine(st0) vec4 sf0(float param) { return param; }\nlayout(location = i ) subroutine uniform st0 u0;"
             ,&local_51);
  std::__cxx11::string::string((string *)&local_50,local_30);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeCompile
                    (&this->super_ExplicitUniformLocationCaseBase,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		std::string def = NL "const int i = 1;" NL "subroutine vec4 st0(float param);" NL
							 "subroutine(st0) vec4 sf0(float param) { return param; }" NL
							 "layout(location = i ) subroutine uniform st0 u0;";
		return doRunNegativeCompile(def);
	}